

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O2

void QHashPrivate::Node<void_const*,QCss::StyleSheet>::createInPlace<QCss::StyleSheet_const&>
               (Node<const_void_*,_QCss::StyleSheet> *n,void **k,StyleSheet *args)

{
  n->key = *k;
  QCss::StyleSheet::StyleSheet(&n->value,args);
  return;
}

Assistant:

static void createInPlace(Node *n, Key &&k, Args &&... args)
    { new (n) Node{ std::move(k), T(std::forward<Args>(args)...) }; }